

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.hpp
# Opt level: O1

ssize_t __thiscall
boost::deflate::detail::window::write(window *this,int __fd,void *__buf,size_t __n)

{
  _Head_base<0UL,_unsigned_char_*,_false> __s;
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  void *__n_00;
  size_t __n_01;
  ushort uVar5;
  
  pvVar1 = (void *)CONCAT44(in_register_00000034,__fd);
  if ((this->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0) {
    uVar5 = this->capacity_;
    __s._M_head_impl = (uchar *)operator_new__((ulong)uVar5);
    memset(__s._M_head_impl,0,(ulong)uVar5);
    (this->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __s._M_head_impl;
  }
  __n_00 = (void *)(ulong)this->capacity_;
  if (__buf < __n_00) {
    uVar4 = (ulong)this->i_;
    if (__n_00 < (void *)(uVar4 + (long)__buf)) {
      __n_01 = (long)__n_00 - uVar4;
      memcpy((this->p_)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar4,pvVar1,__n_01);
      uVar5 = (short)__buf - (short)__n_01;
      this->i_ = uVar5;
      memcpy((this->p_)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
             (void *)((long)pvVar1 + __n_01),(ulong)uVar5);
      uVar3 = (ulong)this->capacity_;
      this->size_ = this->capacity_;
    }
    else {
      memcpy((this->p_)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar4,pvVar1,(size_t)__buf
            );
      uVar4 = (ulong)this->capacity_;
      uVar5 = (short)__buf + this->size_;
      if (uVar4 - (long)__buf <= (ulong)this->size_) {
        uVar5 = this->capacity_;
      }
      this->size_ = uVar5;
      uVar2 = (ulong)this->i_ + (long)__buf;
      uVar3 = uVar2 / uVar4;
      this->i_ = (uint16_t)(uVar2 % uVar4);
    }
    return uVar3;
  }
  this->i_ = 0;
  this->size_ = this->capacity_;
  pvVar1 = memcpy((this->p_)._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                  (void *)((long)pvVar1 + ((long)__buf - (long)__n_00)),(size_t)__n_00);
  return (ssize_t)pvVar1;
}

Assistant:

void
    write(std::uint8_t const* in, std::size_t n)
    {
        if(! p_)
            p_ = boost::make_unique<
                std::uint8_t[]>(capacity_);
        if(n >= capacity_)
        {
            i_ = 0;
            size_ = capacity_;
            std::memcpy(&p_[0], in + (n - size_), size_);
            return;
        }
        if(i_ + n <= capacity_)
        {
            std::memcpy(&p_[i_], in, n);
            if(size_ >= capacity_ - n)
                size_ = capacity_;
            else
                size_ = static_cast<std::uint16_t>(size_ + n);

            i_ = static_cast<std::uint16_t>(
                (i_ + n) % capacity_);
            return;
        }
        auto m = capacity_ - i_;
        std::memcpy(&p_[i_], in, m);
        in += m;
        i_ = static_cast<std::uint16_t>(n - m);
        std::memcpy(&p_[0], in, i_);
        size_ = capacity_;
    }